

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O2

void __thiscall CNetMessage::CNetMessage(CNetMessage *this,DataStream *recv_in)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::DataStream(&this->m_recv,recv_in);
  (this->m_time).__r = 0;
  this->m_message_size = 0;
  this->m_raw_message_size = 0;
  (this->m_type)._M_dataplus._M_p = (pointer)&(this->m_type).field_2;
  (this->m_type)._M_string_length = 0;
  (this->m_type).field_2._M_local_buf[0] = '\0';
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit CNetMessage(DataStream&& recv_in) : m_recv(std::move(recv_in)) {}